

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextFragmentData>::erase_single(QFragmentMapData<QTextFragmentData> *this,uint z)

{
  int *piVar1;
  quint32 *pqVar2;
  uint uVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  Header *pHVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint p;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  long lVar17;
  ulong uVar18;
  
  uVar13 = (ulong)z;
  uVar6 = previous(this,z);
  pHVar8 = (this->field_0).head;
  lVar7 = uVar13 * 0x20;
  puVar16 = (uint *)((long)pHVar8 + lVar7 + 8);
  uVar14 = (ulong)*(uint *)((long)pHVar8 + lVar7 + 4);
  uVar12 = uVar13;
  if (uVar14 != 0) {
    if (*puVar16 == 0) {
      puVar16 = (uint *)((long)pHVar8 + lVar7 + 4);
    }
    else {
      do {
        uVar11 = *puVar16;
        lVar17 = (ulong)uVar11 * 0x20;
        puVar16 = (uint *)((long)pHVar8 + lVar17 + 4);
      } while (*puVar16 != 0);
      puVar16 = (uint *)((long)pHVar8 + lVar17 + 8);
      uVar12 = (ulong)uVar11;
    }
  }
  uVar11 = *puVar16;
  uVar18 = (ulong)uVar11;
  uVar10 = (uint)uVar12;
  if (uVar10 == z) {
    uVar3 = *(uint *)((long)pHVar8 + lVar7);
    uVar14 = (ulong)uVar3;
    if (uVar11 != 0) {
      *(uint *)((long)pHVar8 + uVar18 * 0x20) = uVar3;
    }
    pHVar8 = (this->field_0).head;
    if (uVar3 == 0) {
      pHVar8->root = uVar11;
      uVar14 = 0;
    }
    else if (*(uint *)((long)pHVar8 + uVar14 * 0x20 + 4) == z) {
      *(uint *)((long)pHVar8 + uVar14 * 0x20 + 4) = uVar11;
      pqVar2 = (this->field_0).fragments[uVar14].super_QFragment<1>.size_left_array;
      *pqVar2 = *pqVar2 - (this->field_0).fragments[uVar13].super_QFragment<1>.size_array[0];
    }
    else {
      *(uint *)((long)pHVar8 + uVar14 * 0x20 + 8) = uVar11;
    }
  }
  else {
    *(uint *)((long)pHVar8 + uVar14 * 0x20) = uVar10;
    lVar17 = uVar12 * 0x20;
    *(undefined4 *)((long)(this->field_0).head + lVar17 + 4) =
         *(undefined4 *)((long)(this->field_0).head + lVar7 + 4);
    *(undefined4 *)((long)(this->field_0).head + lVar17 + 0x10) =
         *(undefined4 *)((long)(this->field_0).head + lVar7 + 0x10);
    pHVar8 = (this->field_0).head;
    uVar14 = uVar12;
    if (uVar10 != *(uint *)((long)pHVar8 + lVar7 + 8)) {
      uVar3 = *(uint *)((long)pHVar8 + lVar17);
      uVar14 = (ulong)uVar3;
      if (uVar11 != 0) {
        *(uint *)((long)pHVar8 + uVar18 * 0x20) = uVar3;
      }
      *(uint *)((long)(this->field_0).head + uVar14 * 0x20 + 4) = uVar11;
      *(undefined4 *)((long)(this->field_0).head + lVar17 + 8) =
           *(undefined4 *)((long)(this->field_0).head + lVar7 + 8);
      *(uint *)((long)(this->field_0).head +
               (ulong)*(uint *)((long)(this->field_0).head + lVar7 + 8) * 0x20) = uVar10;
      uVar15 = uVar14;
      while (uVar3 != uVar10) {
        pqVar2 = (this->field_0).fragments[uVar15].super_QFragment<1>.size_left_array;
        *pqVar2 = *pqVar2 - (this->field_0).fragments[uVar12].super_QFragment<1>.size_array[0];
        uVar3 = *(uint *)((long)(this->field_0).head + uVar15 * 0x20);
        uVar15 = (ulong)uVar3;
      }
    }
    pHVar8 = (this->field_0).head;
    uVar11 = *(uint *)((long)pHVar8 + lVar7);
    uVar12 = (ulong)uVar11;
    if (uVar12 == 0) {
      pHVar8->root = uVar10;
    }
    else if (*(uint *)((long)pHVar8 + uVar12 * 0x20 + 4) == z) {
      *(uint *)((long)pHVar8 + uVar12 * 0x20 + 4) = uVar10;
      pqVar2 = (this->field_0).fragments[uVar12].super_QFragment<1>.size_left_array;
      *pqVar2 = *pqVar2 - (this->field_0).fragments[uVar13].super_QFragment<1>.size_array[0];
    }
    else {
      *(uint *)((long)pHVar8 + uVar12 * 0x20 + 8) = uVar10;
    }
    *(uint *)((long)(this->field_0).head + lVar17) = uVar11;
    pHVar8 = (this->field_0).head;
    uVar4 = *(undefined4 *)((long)pHVar8 + lVar17 + 0xc);
    *(undefined4 *)((long)pHVar8 + lVar17 + 0xc) = *(undefined4 *)((long)pHVar8 + lVar7 + 0xc);
    *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = uVar4;
    uVar10 = z;
  }
  pHVar8 = (this->field_0).head;
  uVar11 = *(uint *)((long)pHVar8 + uVar13 * 0x20);
  for (; uVar11 != 0; uVar11 = *(uint *)((long)pHVar8 + (ulong)uVar11 * 0x20)) {
    uVar12 = (ulong)uVar11;
    lVar17 = (ulong)uVar11 * 0x20;
    if (*(int *)((long)pHVar8 + lVar17 + 4) == (int)uVar13) {
      piVar1 = (int *)((long)pHVar8 + lVar17 + 0x10);
      *piVar1 = *piVar1 - *(int *)((long)pHVar8 + lVar7 + 0x14);
    }
    pHVar8 = (this->field_0).head;
    uVar13 = uVar12;
  }
  *(quint32 *)((long)pHVar8 + lVar7 + 8) = pHVar8->freelist;
  ((this->field_0).head)->freelist = z;
  pqVar2 = &((this->field_0).head)->node_count;
  *pqVar2 = *pqVar2 - 1;
  if (*(int *)((long)(this->field_0).head + (ulong)uVar10 * 0x20 + 0xc) != 0) {
    pHVar8 = (this->field_0).head;
    if (*(int *)((long)pHVar8 + uVar18 * 0x20) != 0) {
      lVar7 = uVar18 * 0x20 + (long)pHVar8;
      do {
        if (((uint)uVar18 != 0) && (*(int *)(lVar7 + 0xc) != 1)) break;
        uVar10 = (uint)uVar14;
        lVar7 = uVar14 * 0x20;
        uVar11 = *(uint *)((long)pHVar8 + lVar7 + 4);
        uVar13 = (ulong)uVar11;
        if ((uint)uVar18 == uVar11) {
          uVar13 = (ulong)*(uint *)((long)pHVar8 + lVar7 + 8);
          if (*(int *)((long)pHVar8 + uVar13 * 0x20 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar8 + uVar13 * 0x20 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = 0;
            rotateLeft(this,uVar10);
            uVar13 = (ulong)*(uint *)((long)(this->field_0).head + lVar7 + 8);
          }
          pHVar8 = (this->field_0).head;
          uVar11 = (uint)uVar13;
          lVar9 = uVar13 * 0x20;
          lVar17 = (long)pHVar8 + lVar9;
          uVar13 = (ulong)*(uint *)((long)pHVar8 + lVar9 + 4);
          if (((uVar13 != 0) && (*(int *)((long)pHVar8 + uVar13 * 0x20 + 0xc) != 1)) ||
             (((ulong)*(uint *)(lVar17 + 8) != 0 &&
              (*(int *)((long)pHVar8 + (ulong)*(uint *)(lVar17 + 8) * 0x20 + 0xc) != 1)))) {
            if (((ulong)*(uint *)(lVar17 + 8) == 0) ||
               (*(int *)((long)pHVar8 + (ulong)*(uint *)(lVar17 + 8) * 0x20 + 0xc) == 1)) {
              if (uVar13 != 0) {
                *(undefined4 *)((long)pHVar8 + uVar13 * 0x20 + 0xc) = 1;
              }
              *(undefined4 *)((long)(this->field_0).head + lVar9 + 0xc) = 0;
              rotateRight(this,*(uint *)((long)(this->field_0).head + lVar7 + 8));
              uVar11 = *(uint *)((long)(this->field_0).head + lVar7 + 8);
            }
            *(undefined4 *)((long)(this->field_0).head + (ulong)uVar11 * 0x20 + 0xc) =
                 *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc);
            *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = 1;
            uVar13 = (ulong)*(uint *)((long)(this->field_0).head + (ulong)uVar11 * 0x20 + 8);
            if (uVar13 != 0) {
              *(undefined4 *)((long)(this->field_0).head + uVar13 * 0x20 + 0xc) = 1;
            }
            rotateLeft(this,uVar10);
            goto LAB_004e0935;
          }
LAB_004e0898:
          *(undefined4 *)(lVar17 + 0xc) = 0;
          uVar10 = *(uint *)((long)(this->field_0).head + lVar7);
          bVar5 = true;
          uVar18 = uVar14;
        }
        else {
          if (*(int *)((long)pHVar8 + uVar13 * 0x20 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar8 + uVar13 * 0x20 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = 0;
            rotateRight(this,uVar10);
            uVar13 = (ulong)*(uint *)((long)(this->field_0).head + lVar7 + 4);
          }
          pHVar8 = (this->field_0).head;
          uVar11 = (uint)uVar13;
          lVar9 = uVar13 * 0x20;
          lVar17 = (long)pHVar8 + lVar9;
          uVar13 = (ulong)*(uint *)((long)pHVar8 + lVar9 + 8);
          if (((uVar13 == 0) || (*(int *)((long)pHVar8 + uVar13 * 0x20 + 0xc) == 1)) &&
             (((ulong)*(uint *)(lVar17 + 4) == 0 ||
              (*(int *)((long)pHVar8 + (ulong)*(uint *)(lVar17 + 4) * 0x20 + 0xc) == 1))))
          goto LAB_004e0898;
          if (((ulong)*(uint *)(lVar17 + 4) == 0) ||
             (*(int *)((long)pHVar8 + (ulong)*(uint *)(lVar17 + 4) * 0x20 + 0xc) == 1)) {
            if (uVar13 != 0) {
              *(undefined4 *)((long)pHVar8 + uVar13 * 0x20 + 0xc) = 1;
            }
            *(undefined4 *)((long)(this->field_0).head + lVar9 + 0xc) = 0;
            rotateLeft(this,*(uint *)((long)(this->field_0).head + lVar7 + 4));
            uVar11 = *(uint *)((long)(this->field_0).head + lVar7 + 4);
          }
          *(undefined4 *)((long)(this->field_0).head + (ulong)uVar11 * 0x20 + 0xc) =
               *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = 1;
          uVar13 = (ulong)*(uint *)((long)(this->field_0).head + (ulong)uVar11 * 0x20 + 4);
          if (uVar13 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar13 * 0x20 + 0xc) = 1;
          }
          rotateRight(this,uVar10);
LAB_004e0935:
          bVar5 = false;
        }
        if (!bVar5) break;
        pHVar8 = (this->field_0).head;
        lVar7 = (long)pHVar8 + uVar18 * 0x20;
        uVar14 = (ulong)uVar10;
      } while (*(int *)((long)pHVar8 + uVar18 * 0x20) != 0);
    }
    if ((int)uVar18 != 0) {
      *(undefined4 *)((long)(this->field_0).head + uVar18 * 0x20 + 0xc) = 1;
    }
  }
  return uVar6;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}